

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
quantileloss::getRevertingWeight(quantileloss *this,shared_data *sd,float prediction,float eta_t)

{
  float fVar1;
  float t;
  float v;
  float eta_t_local;
  float prediction_local;
  shared_data *sd_local;
  quantileloss *this_local;
  
  fVar1 = (sd->min_label + sd->max_label) * 0.5;
  if (prediction <= fVar1) {
    v = this->tau;
  }
  else {
    v = -(1.0 - this->tau);
  }
  return (fVar1 - prediction) / (eta_t * v);
}

Assistant:

float getRevertingWeight(shared_data* sd, float prediction, float eta_t)
  {
    float v, t;
    t = 0.5f * (sd->min_label + sd->max_label);
    if (prediction > t)
      v = -(1 - tau);
    else
      v = tau;
    return (t - prediction) / (eta_t * v);
  }